

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runxmlconf.c
# Opt level: O0

int xmlconfTestNotWF(char *id,char *filename,int options)

{
  undefined8 uVar1;
  long lVar2;
  uint local_34;
  int ret;
  xmlDocPtr doc;
  xmlParserCtxtPtr ctxt;
  int options_local;
  char *filename_local;
  char *id_local;
  
  uVar1 = xmlNewParserCtxt();
  xmlCtxtSetErrorHandler(uVar1,testErrorHandler,0);
  lVar2 = xmlCtxtReadFile(uVar1,filename,0,options);
  if (lVar2 != 0) {
    test_log("test %s : %s failed to detect not well formedness\n",id,filename);
    nb_errors = nb_errors + 1;
    xmlFreeDoc(lVar2);
  }
  local_34 = (uint)(lVar2 == 0);
  xmlFreeParserCtxt(uVar1);
  return local_34;
}

Assistant:

static int
xmlconfTestNotWF(const char *id, const char *filename, int options) {
    xmlParserCtxtPtr ctxt;
    xmlDocPtr doc;
    int ret = 1;

    ctxt = xmlNewParserCtxt();
    xmlCtxtSetErrorHandler(ctxt, testErrorHandler, NULL);
    doc = xmlCtxtReadFile(ctxt, filename, NULL, options);
    if (doc != NULL) {
        test_log("test %s : %s failed to detect not well formedness\n",
	         id, filename);
        nb_errors++;
	xmlFreeDoc(doc);
	ret = 0;
    }
    xmlFreeParserCtxt(ctxt);
    return(ret);
}